

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppleII.cpp
# Opt level: O3

void __thiscall
Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)1,_true>::ConcreteMachine
          (ConcreteMachine<(Analyser::Static::AppleII::Target::Model)1,_true> *this,Target *target,
          ROMFetcher *rom_fetcher)

{
  AsyncTaskQueue<false,_true,_void> *this_00;
  CompoundSource<(anonymous_namespace)::StretchedAYPair,_Audio::Toggle> *this_01;
  undefined8 *puVar1;
  Delegate *pDVar2;
  Model MVar3;
  DiskController DVar4;
  int iVar5;
  Card *pCVar6;
  pointer pNVar7;
  pointer __dest;
  pointer puVar8;
  _Any_data *p_Var9;
  DiskIICard *this_02;
  SCSICard *this_03;
  Mockingboard *this_04;
  long lVar10;
  undefined4 *puVar11;
  pointer pNVar12;
  pointer pNVar13;
  pointer pNVar14;
  Name name;
  pointer pNVar15;
  pointer puVar16;
  Name name_00;
  SCSIController SVar17;
  const_iterator __cbeg;
  bool bVar18;
  float cycles_per_second;
  float high_frequency;
  map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  roms;
  undefined1 local_118 [8];
  undefined1 auStack_110 [8];
  vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> local_108;
  pointer local_f0;
  LowpassBase<Outputs::Speaker::PullLowpass<Outputs::Speaker::CompoundSource<(anonymous_namespace)::StretchedAYPair,_Audio::Toggle>_>,_true>
  *local_e0;
  AsyncTaskQueue<false,_true,_void> *local_d8;
  SCSIController local_cc;
  undefined1 local_c8 [16];
  vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> local_b8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_a0;
  VideoSwitches<Cycles> *local_98;
  StretchedAYPair *local_90;
  Request local_88;
  Keyboard *local_60;
  CompoundSource<(anonymous_namespace)::StretchedAYPair,_Audio::Toggle> *local_58;
  _Any_data *local_50;
  vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> local_48;
  
  (this->super_Machine)._vptr_Machine = (_func_int **)&PTR__Machine_00592408;
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)&PTR_run_for_00591648;
  (this->super_TimedMachine).clock_rate_ = 1.0;
  (this->super_TimedMachine).clock_conversion_error_ = 0.0;
  (this->super_TimedMachine).speed_multiplier_ = 1.0;
  (this->super_ScanProducer)._vptr_ScanProducer = (_func_int **)&PTR___cxa_pure_virtual_00591610;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&PTR___cxa_pure_virtual_00590d68;
  (this->super_MediaTarget)._vptr_MediaTarget = (_func_int **)&PTR___cxa_pure_virtual_00591690;
  local_108.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)auStack_110;
  local_108.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_118 = (undefined1  [8])0x0;
  auStack_110._0_4_ = Any;
  auStack_110._4_4_ = None;
  local_f0 = (pointer)0x0;
  local_108.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_108.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl
       .super__Vector_impl_data._M_finish;
  local_50 = (_Any_data *)rom_fetcher;
  MachineTypes::MappedKeyboardMachine::MappedKeyboardMachine
            (&this->super_MappedKeyboardMachine,
             (set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
              *)local_118);
  std::
  _Rb_tree<Inputs::Keyboard::Key,_Inputs::Keyboard::Key,_std::_Identity<Inputs::Keyboard::Key>,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  ::~_Rb_tree((_Rb_tree<Inputs::Keyboard::Key,_Inputs::Keyboard::Key,_std::_Identity<Inputs::Keyboard::Key>,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
               *)local_118);
  (this->super_Machine)._vptr_Machine = (_func_int **)&PTR__ConcreteMachine_00592740;
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)&PTR_run_for_005927f0;
  (this->super_ScanProducer)._vptr_ScanProducer = (_func_int **)&PTR_set_scan_target_00592838;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&DAT_00592870;
  (this->super_MediaTarget)._vptr_MediaTarget = (_func_int **)&DAT_00592888;
  (this->super_MappedKeyboardMachine).super_Delegate._vptr_Delegate =
       (_func_int **)&PTR_keyboard_did_change_key_005928a0;
  (this->super_MappedKeyboardMachine).super_KeyboardMachine.super_KeyActions._vptr_KeyActions =
       (_func_int **)&PTR_set_key_state_005928d0;
  (this->super_JoystickMachine)._vptr_JoystickMachine = (_func_int **)&DAT_00592910;
  (this->super_Device)._vptr_Device = (_func_int **)&PTR_set_options_00592928;
  (this->super_Source)._vptr_Source = (_func_int **)&DAT_00592948;
  (this->super_Delegate)._vptr_Delegate =
       (_func_int **)&PTR_card_did_change_select_constraints_00592960;
  CPU::MOS6502::ProcessorStorage::ProcessorStorage((ProcessorStorage *)&this->m6502_,P6502);
  (this->m6502_).bus_handler_ = this;
  (this->video_bus_handler_).ram_ = this->ram_;
  (this->video_bus_handler_).aux_ram_ = this->aux_ram_;
  local_98 = (VideoSwitches<Cycles> *)&this->video_;
  II::Video::
  Video<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)1,_true>::VideoBusHandler,_false>
  ::Video((Video<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)1,_true>::VideoBusHandler,_false>
           *)local_98,&this->video_bus_handler_);
  this->cycles_into_current_line_ = 0;
  (this->cycles_since_video_update_).super_WrappedInt<Cycles>.length_ = 0;
  local_a0 = &this->rom_;
  (this->rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &this->audio_queue_;
  Concurrency::AsyncTaskQueue<false,_true,_void>::AsyncTaskQueue<>(this_00);
  local_d8 = this_00;
  Audio::Toggle::Toggle(&this->audio_toggle_,this_00);
  local_90 = &this->ays_;
  GI::AY38910::AY38910SampleSource<false>::AY38910SampleSource
            ((AY38910SampleSource<false> *)local_90,AY38910,local_d8);
  GI::AY38910::AY38910SampleSource<false>::AY38910SampleSource
            ((AY38910SampleSource<false> *)&(this->ays_).super_AYPair.field_0x1150,AY38910,local_d8)
  ;
  (this->ays_).phase_ = 0;
  (this->ays_).subdivider_ = 0;
  this_01 = &this->mixer_;
  Outputs::Speaker::CompoundSource<(anonymous_namespace)::StretchedAYPair,_Audio::Toggle>::
  CompoundSource(this_01,local_90,&this->audio_toggle_);
  local_e0 = &(this->speaker_).
              super_LowpassBase<Outputs::Speaker::PullLowpass<Outputs::Speaker::CompoundSource<(anonymous_namespace)::StretchedAYPair,_Audio::Toggle>_>,_true>
  ;
  local_58 = this_01;
  Outputs::Speaker::
  PullLowpass<Outputs::Speaker::CompoundSource<(anonymous_namespace)::StretchedAYPair,_Audio::Toggle>_>
  ::PullLowpass((PullLowpass<Outputs::Speaker::CompoundSource<(anonymous_namespace)::StretchedAYPair,_Audio::Toggle>_>
                 *)local_e0,this_01);
  (this->cycles_since_audio_update_).super_WrappedInt<Cycles>.length_ = 0;
  this->active_card_ = 7;
  (this->cards_)._M_elems[0]._M_t.
  super___uniq_ptr_impl<Apple::II::Card,_std::default_delete<Apple::II::Card>_>._M_t.
  super__Tuple_impl<0UL,_Apple::II::Card_*,_std::default_delete<Apple::II::Card>_>.
  super__Head_base<0UL,_Apple::II::Card_*,_false>._M_head_impl = (Card *)0x0;
  (this->cards_)._M_elems[1]._M_t.
  super___uniq_ptr_impl<Apple::II::Card,_std::default_delete<Apple::II::Card>_>._M_t.
  super__Tuple_impl<0UL,_Apple::II::Card_*,_std::default_delete<Apple::II::Card>_>.
  super__Head_base<0UL,_Apple::II::Card_*,_false>._M_head_impl = (Card *)0x0;
  (this->cards_)._M_elems[2]._M_t.
  super___uniq_ptr_impl<Apple::II::Card,_std::default_delete<Apple::II::Card>_>._M_t.
  super__Tuple_impl<0UL,_Apple::II::Card_*,_std::default_delete<Apple::II::Card>_>.
  super__Head_base<0UL,_Apple::II::Card_*,_false>._M_head_impl = (Card *)0x0;
  (this->cards_)._M_elems[3]._M_t.
  super___uniq_ptr_impl<Apple::II::Card,_std::default_delete<Apple::II::Card>_>._M_t.
  super__Tuple_impl<0UL,_Apple::II::Card_*,_std::default_delete<Apple::II::Card>_>.
  super__Head_base<0UL,_Apple::II::Card_*,_false>._M_head_impl = (Card *)0x0;
  (this->cards_)._M_elems[4]._M_t.
  super___uniq_ptr_impl<Apple::II::Card,_std::default_delete<Apple::II::Card>_>._M_t.
  super__Tuple_impl<0UL,_Apple::II::Card_*,_std::default_delete<Apple::II::Card>_>.
  super__Head_base<0UL,_Apple::II::Card_*,_false>._M_head_impl = (Card *)0x0;
  (this->cards_)._M_elems[5]._M_t.
  super___uniq_ptr_impl<Apple::II::Card,_std::default_delete<Apple::II::Card>_>._M_t.
  super__Tuple_impl<0UL,_Apple::II::Card_*,_std::default_delete<Apple::II::Card>_>.
  super__Head_base<0UL,_Apple::II::Card_*,_false>._M_head_impl = (Card *)0x0;
  (this->cards_)._M_elems[6]._M_t.
  super___uniq_ptr_impl<Apple::II::Card,_std::default_delete<Apple::II::Card>_>._M_t.
  super__Tuple_impl<0UL,_Apple::II::Card_*,_std::default_delete<Apple::II::Card>_>.
  super__Head_base<0UL,_Apple::II::Card_*,_false>._M_head_impl = (Card *)0x0;
  (this->cards_)._M_elems[7]._M_t.
  super___uniq_ptr_impl<Apple::II::Card,_std::default_delete<Apple::II::Card>_>._M_t.
  super__Tuple_impl<0UL,_Apple::II::Card_*,_std::default_delete<Apple::II::Card>_>.
  super__Head_base<0UL,_Apple::II::Card_*,_false>._M_head_impl = (Card *)0x0;
  (this->cycles_since_card_update_).super_WrappedInt<Cycles>.length_ = 0;
  (this->every_cycle_cards_).
  super__Vector_base<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->every_cycle_cards_).
  super__Vector_base<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->every_cycle_cards_).
  super__Vector_base<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->just_in_time_cards_).
  super__Vector_base<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->just_in_time_cards_).
  super__Vector_base<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->just_in_time_cards_).
           super__Vector_base<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->just_in_time_cards_).
           super__Vector_base<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  this->card_lists_are_dirty_ = true;
  this->card_became_just_in_time_ = false;
  (this->language_card_).machine_ = this;
  (this->language_card_).state_.bank2 = true;
  (this->language_card_).state_.read = false;
  (this->language_card_).state_.write = false;
  (this->language_card_).pre_write_ = false;
  (this->auxiliary_switches_).machine_ = this;
  (this->auxiliary_switches_).switches_.read_auxiliary_memory = false;
  (this->auxiliary_switches_).switches_.write_auxiliary_memory = false;
  (this->auxiliary_switches_).switches_.internal_CX_rom = false;
  (this->auxiliary_switches_).switches_.slot_C3_rom = false;
  (this->auxiliary_switches_).switches_.internal_C8_rom = false;
  (this->auxiliary_switches_).switches_.store_80 = false;
  (this->auxiliary_switches_).switches_.alternative_zero_page = false;
  (this->auxiliary_switches_).switches_.video_page_2 = false;
  *(undefined8 *)&(this->auxiliary_switches_).switches_.high_resolution = 0;
  (this->auxiliary_switches_).card_state_.region_C1_C3 = false;
  (this->auxiliary_switches_).card_state_.region_C3 = false;
  (this->auxiliary_switches_).card_state_.region_C4_C8 = false;
  (this->auxiliary_switches_).card_state_.region_C8_D0 = false;
  local_60 = &this->keyboard_;
  Keyboard::Keyboard(local_60,&this->m6502_);
  JoystickPair::JoystickPair(&this->joysticks_);
  p_Var9 = local_50;
  (this->super_TimedMachine).clock_rate_ = 1020484.3201754387;
  Outputs::Speaker::
  LowpassBase<Outputs::Speaker::PullLowpass<Outputs::Speaker::CompoundSource<(anonymous_namespace)::StretchedAYPair,_Audio::Toggle>_>,_true>
  ::set_input_rate(local_e0,cycles_per_second);
  Outputs::Speaker::
  LowpassBase<Outputs::Speaker::PullLowpass<Outputs::Speaker::CompoundSource<(anonymous_namespace)::StretchedAYPair,_Audio::Toggle>_>,_true>
  ::set_high_frequency_cutoff(local_e0,high_frequency);
  Memory::Fuzz(this->ram_,0x10000);
  Memory::Fuzz(this->aux_ram_,0x10000);
  MVar3 = target->model;
  bVar18 = MVar3 - IIplus < 3;
  name = AppleIIOriginal;
  if (bVar18) {
    name = MVar3 * 2 + CPC6128BASIC;
  }
  name_00 = AppleIICharacter;
  if (bVar18) {
    name_00 = MVar3 * 2 + AppleIIOriginal;
  }
  ROM::Request::Request((Request *)local_118,name_00,false);
  ROM::Request::Request(&local_88,name,false);
  ROM::Request::operator&&((Request *)local_c8,(Request *)local_118,&local_88);
  std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
            (&local_88.node.children);
  std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector(&local_108);
  DVar4 = target->disk_controller;
  if (DVar4 != None) {
    DiskIICard::rom_request(&local_88,DVar4 == SixteenSector);
    ROM::Request::operator&&((Request *)local_118,(Request *)local_c8,&local_88);
    local_48.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_b8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_48.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_b8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_48.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_b8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_c8[8] = auStack_110[0];
    local_c8._0_8_ = local_118;
    local_b8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_108.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_b8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_108.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_b8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_108.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_108.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_108.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_108.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector(&local_48);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector(&local_108);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              (&local_88.node.children);
  }
  SVar17 = target->scsi_controller;
  if (SVar17 == AppleSCSI) {
    SCSICard::rom_request();
    local_cc = SVar17;
    ROM::Request::operator&&((Request *)local_118,(Request *)local_c8,&local_88);
    local_48.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_b8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_48.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_b8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_48.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_b8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_c8[8] = auStack_110[0];
    local_c8._0_8_ = local_118;
    local_b8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_108.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_b8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_108.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_b8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_108.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_108.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_108.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_108.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector(&local_48);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector(&local_108);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              (&local_88.node.children);
    SVar17 = local_cc;
  }
  if (*(long *)(p_Var9 + 1) == 0) {
    std::__throw_bad_function_call();
  }
  (**(code **)((long)p_Var9 + 0x18))
            ((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              *)local_118,p_Var9,(Request *)local_c8);
  bVar18 = ROM::Request::validate((Request *)local_c8,(Map *)local_118);
  if (!bVar18) {
    puVar11 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar11 = 0;
    __cxa_throw(puVar11,&ROMMachine::Error::typeinfo,0);
  }
  pDVar2 = &this->super_Delegate;
  if (DVar4 != None) {
    this_02 = (DiskIICard *)operator_new(0x478);
    DiskIICard::DiskIICard(this_02,(Map *)local_118,DVar4 == SixteenSector);
    pCVar6 = (this->cards_)._M_elems[5]._M_t.
             super___uniq_ptr_impl<Apple::II::Card,_std::default_delete<Apple::II::Card>_>._M_t.
             super__Tuple_impl<0UL,_Apple::II::Card_*,_std::default_delete<Apple::II::Card>_>.
             super__Head_base<0UL,_Apple::II::Card_*,_false>._M_head_impl;
    (this->cards_)._M_elems[5]._M_t.
    super___uniq_ptr_impl<Apple::II::Card,_std::default_delete<Apple::II::Card>_>._M_t.
    super__Tuple_impl<0UL,_Apple::II::Card_*,_std::default_delete<Apple::II::Card>_>.
    super__Head_base<0UL,_Apple::II::Card_*,_false>._M_head_impl = (Card *)this_02;
    if (pCVar6 != (Card *)0x0) {
      (*pCVar6->_vptr_Card[1])();
    }
    (this_02->super_Card).delegate_ = pDVar2;
    pick_card_messaging_group(this,(Card *)this_02);
  }
  if (SVar17 == AppleSCSI) {
    this_03 = (SCSICard *)operator_new(0x61d8);
    SCSICard::SCSICard(this_03,(Map *)local_118,0xf9b07);
    pCVar6 = (this->cards_)._M_elems[6]._M_t.
             super___uniq_ptr_impl<Apple::II::Card,_std::default_delete<Apple::II::Card>_>._M_t.
             super__Tuple_impl<0UL,_Apple::II::Card_*,_std::default_delete<Apple::II::Card>_>.
             super__Head_base<0UL,_Apple::II::Card_*,_false>._M_head_impl;
    (this->cards_)._M_elems[6]._M_t.
    super___uniq_ptr_impl<Apple::II::Card,_std::default_delete<Apple::II::Card>_>._M_t.
    super__Tuple_impl<0UL,_Apple::II::Card_*,_std::default_delete<Apple::II::Card>_>.
    super__Head_base<0UL,_Apple::II::Card_*,_false>._M_head_impl = (Card *)this_03;
    if (pCVar6 != (Card *)0x0) {
      (*pCVar6->_vptr_Card[1])();
    }
    (this_03->super_Card).delegate_ = pDVar2;
    pick_card_messaging_group(this,(Card *)this_03);
  }
  if (target->has_mockingboard == true) {
    this_04 = (Mockingboard *)operator_new(0x108);
    Mockingboard::Mockingboard(this_04,&local_90->super_AYPair);
    pCVar6 = (this->cards_)._M_elems[3]._M_t.
             super___uniq_ptr_impl<Apple::II::Card,_std::default_delete<Apple::II::Card>_>._M_t.
             super__Tuple_impl<0UL,_Apple::II::Card_*,_std::default_delete<Apple::II::Card>_>.
             super__Head_base<0UL,_Apple::II::Card_*,_false>._M_head_impl;
    (this->cards_)._M_elems[3]._M_t.
    super___uniq_ptr_impl<Apple::II::Card,_std::default_delete<Apple::II::Card>_>._M_t.
    super__Tuple_impl<0UL,_Apple::II::Card_*,_std::default_delete<Apple::II::Card>_>.
    super__Head_base<0UL,_Apple::II::Card_*,_false>._M_head_impl = (Card *)this_04;
    if (pCVar6 != (Card *)0x0) {
      (*pCVar6->_vptr_Card[1])();
    }
    (this_04->super_Card).delegate_ = pDVar2;
    pick_card_messaging_group(this,(Card *)this_04);
  }
  pNVar14 = (pointer)auStack_110;
  pNVar15 = (pointer)auStack_110;
  pNVar7 = local_108.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (local_108.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    do {
      pNVar12 = pNVar7;
      pNVar13 = pNVar14;
      iVar5 = *(int *)&(pNVar12->children).
                       super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
      pNVar14 = pNVar12;
      if (iVar5 < (int)name) {
        pNVar14 = pNVar13;
      }
      pNVar7 = (&(pNVar12->children).
                 super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl
                 .super__Vector_impl_data._M_start)[iVar5 < (int)name];
    } while (pNVar7 != (pointer)0x0);
    pNVar15 = (pointer)auStack_110;
    if (pNVar14 != (pointer)auStack_110) {
      if (iVar5 < (int)name) {
        pNVar12 = pNVar13;
      }
      pNVar15 = pNVar14;
      if ((int)name <
          *(int *)&(pNVar12->children).
                   super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage) {
        pNVar15 = (pointer)auStack_110;
      }
    }
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign(local_a0,pNVar15 + 1);
  if ((name & AppleIIeCharacter) == AppleIIe) {
    __dest = (this->rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar16 = (this->rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
              .super__Vector_impl_data._M_finish;
    if ((0x3f00 < (ulong)((long)puVar16 - (long)__dest)) &&
       (puVar16 = puVar16 + -0x3f00, __dest != puVar16)) {
      memmove(__dest,puVar16,0x3f00);
      puVar8 = (this->rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (puVar8 != __dest + ((long)puVar8 - (long)puVar16)) {
        (this->rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = __dest + ((long)puVar8 - (long)puVar16);
      }
    }
  }
  pNVar14 = (pointer)auStack_110;
  pNVar15 = (pointer)auStack_110;
  pNVar7 = local_108.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (local_108.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    do {
      pNVar12 = pNVar7;
      pNVar13 = pNVar14;
      iVar5 = *(int *)&(pNVar12->children).
                       super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
      pNVar14 = pNVar12;
      if (iVar5 < (int)name_00) {
        pNVar14 = pNVar13;
      }
      pNVar7 = (&(pNVar12->children).
                 super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl
                 .super__Vector_impl_data._M_start)[iVar5 < (int)name_00];
    } while (pNVar7 != (pointer)0x0);
    if (pNVar14 != (pointer)auStack_110) {
      if (iVar5 < (int)name_00) {
        pNVar12 = pNVar13;
      }
      if (*(int *)&(pNVar12->children).
                   super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage <= (int)name_00) {
        pNVar15 = pNVar14;
      }
    }
  }
  VideoSwitches<Cycles>::set_character_rom
            (local_98,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)(pNVar15 + 1));
  set_paging<3>(this);
  lVar10 = 0x4859;
  do {
    puVar1 = (undefined8 *)((long)this + lVar10 * 8 + -0x800);
    *puVar1 = 0;
    puVar1[1] = 0;
    (&this->super_Machine)[lVar10]._vptr_Machine = (_func_int **)0x0;
    ((TimedMachine *)(&this->super_Machine + lVar10 + 1))->_vptr_TimedMachine = (_func_int **)0x0;
    lVar10 = lVar10 + 2;
  } while (lVar10 != 0x4869);
  insert_media(this,&(target->super_Target).media);
  std::
  _Rb_tree<ROM::Name,_std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<ROM::Name,_std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               *)local_118);
  std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector(&local_b8);
  return;
}

Assistant:

ConcreteMachine(const Analyser::Static::AppleII::Target &target, const ROMMachine::ROMFetcher &rom_fetcher):
			m6502_(*this),
			video_bus_handler_(ram_, aux_ram_),
			video_(video_bus_handler_),
			audio_toggle_(audio_queue_),
			ays_(audio_queue_),
			mixer_(ays_, audio_toggle_),
			speaker_(lowpass_source()),
			language_card_(*this),
			auxiliary_switches_(*this),
			keyboard_(&m6502_) {

			// This is where things get slightly convoluted: establish the machine as having a clock rate
			// equal to the number of cycles of work the 6502 will actually achieve. Which is less than
			// the master clock rate divided by 14 because every 65th cycle is extended by one seventh.
			set_clock_rate((master_clock / 14.0) * 65.0 / (65.0 + 1.0 / 7.0));

			// The speaker, however, should think it is clocked at half the master clock, per a general
			// decision to sample it at seven times the CPU clock (plus stretches).
			speaker_.set_input_rate(float(master_clock / (2.0 * float(audio_divider))));

			// Apply a 6Khz low-pass filter. This was picked by ear and by an attempt to understand the
			// Apple II schematic but, well, I don't claim much insight on the latter. This is definitely
			// something to review in the future.
			speaker_.set_high_frequency_cutoff(6000);

			// Also, start with randomised memory contents.
			Memory::Fuzz(ram_, sizeof(ram_));
			Memory::Fuzz(aux_ram_, sizeof(aux_ram_));

			// Pick the required ROMs.
			using Target = Analyser::Static::AppleII::Target;
			ROM::Name character, system;

			switch(target.model) {
				default:
					character = ROM::Name::AppleIICharacter;
					system = ROM::Name::AppleIIOriginal;
				break;
				case Target::Model::IIplus:
					character = ROM::Name::AppleIICharacter;
					system = ROM::Name::AppleIIPlus;
				break;
				case Target::Model::IIe:
					character = ROM::Name::AppleIIeCharacter;
					system = ROM::Name::AppleIIe;
				break;
				case Target::Model::EnhancedIIe:
					character = ROM::Name::AppleIIEnhancedECharacter;
					system = ROM::Name::AppleIIEnhancedE;
				break;
			}

			ROM::Request request = ROM::Request(character) && ROM::Request(system);

			// Add the necessary Disk II requests if appropriate.
			const bool has_disk_controller = target.disk_controller != Target::DiskController::None;
			const bool is_sixteen_sector = target.disk_controller == Target::DiskController::SixteenSector;
			if(has_disk_controller) {
				request = request && DiskIICard::rom_request(is_sixteen_sector);
			}

			// Add a SCSI card if requested.
			const bool has_scsi_card = target.scsi_controller == Target::SCSIController::AppleSCSI;
			if(has_scsi_card) {
				request = request && SCSICard::rom_request();
			}

			// Request, validate and install ROMs.
			auto roms = rom_fetcher(request);
			if(!request.validate(roms)) {
				throw ROMMachine::Error::MissingROMs;
			}

			if(has_disk_controller) {
				install_card(DiskIISlot, new Apple::II::DiskIICard(roms, is_sixteen_sector));
			}

			if(has_scsi_card) {
				// Rounding the clock rate slightly shouldn't matter, but:
				// TODO: be [slightly] more honest about clock rate.
				install_card(SCSISlot, new Apple::II::SCSICard(roms, int(master_clock / 14.0f)));
			}

			if(target.has_mockingboard) {
				// The Mockingboard has a parasitic relationship with this class due to the way
				// that audio outputs are implemented in this emulator.
				install_card(MockingboardSlot, new Apple::II::Mockingboard(ays_));
			}

			rom_ = std::move(roms.find(system)->second);
			// The IIe and Enhanced IIe ROMs often distributed are oversized; trim if necessary.
			if(system == ROM::Name::AppleIIe || system == ROM::Name::AppleIIEnhancedE) {
				if(rom_.size() > 16128) {
					rom_.erase(rom_.begin(), rom_.end() - 16128);
				}
			}
			video_.set_character_rom(roms.find(character)->second);

			// Set up the default memory blocks. On a II or II+ these values will never change.
			// On a IIe they'll be affected by selection of auxiliary RAM.
			set_paging<PagingType::Main | PagingType::ZeroPage>();

			// Set the whole card area to initially backed by nothing.
			page(0xc0, 0xd0, nullptr, nullptr);

			insert_media(target.media);
		}